

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O0

void __thiscall jbcoin::detail::STVar::STVar(STVar *this,STVar *other)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  STVar *other_local;
  STVar *this_local;
  
  this->p_ = (STBase *)0x0;
  bVar1 = on_heap(other);
  if (bVar1) {
    this->p_ = other->p_;
    other->p_ = (STBase *)0x0;
  }
  else {
    iVar2 = (*other->p_->_vptr_STBase[3])(other->p_,0x48,this);
    this->p_ = (STBase *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

STVar::STVar (STVar&& other)
{
    if (other.on_heap())
    {
        p_ = other.p_;
        other.p_ = nullptr;
    }
    else
    {
        p_ = other.p_->move(max_size, &d_);
    }
}